

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

void icu_63::mergeTimeZoneKey(UnicodeString *mzID,char *result)

{
  ushort uVar1;
  int32_t iVar2;
  char mzIdChar [129];
  char acStack_a8 [144];
  
  uVar1 = (mzID->fUnion).fStackFields.fLengthAndFlags;
  if (uVar1 < 0x20) {
    *result = '\0';
  }
  else {
    if ((short)uVar1 < 0) {
      iVar2 = (mzID->fUnion).fFields.fLength;
    }
    else {
      iVar2 = (int)(short)uVar1 >> 5;
    }
    iVar2 = UnicodeString::extract(mzID,0,iVar2,acStack_a8,0x81,kInvariant);
    builtin_strncpy(result,"meta:",5);
    memcpy(result + 5,acStack_a8,(long)iVar2);
    result[(long)iVar2 + 5] = '\0';
  }
  return;
}

Assistant:

static void mergeTimeZoneKey(const UnicodeString& mzID, char* result) {
    if (mzID.isEmpty()) {
        result[0] = '\0';
        return;
    }

    char mzIdChar[ZID_KEY_MAX + 1];
    int32_t keyLen;
    int32_t prefixLen = static_cast<int32_t>(uprv_strlen(gMZPrefix));
    keyLen = mzID.extract(0, mzID.length(), mzIdChar, ZID_KEY_MAX + 1, US_INV);
    uprv_memcpy((void *)result, (void *)gMZPrefix, prefixLen);
    uprv_memcpy((void *)(result + prefixLen), (void *)mzIdChar, keyLen);
    result[keyLen + prefixLen] = '\0';
}